

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O0

void __thiscall
msdfgen::QuadraticSegment::QuadraticSegment
          (QuadraticSegment *this,Point2 p0,Point2 p1,Point2 p2,EdgeColor edgeColor)

{
  bool bVar1;
  Point2 PVar2;
  Vector2 *local_80;
  Vector2 local_78 [3];
  EdgeColor local_44;
  QuadraticSegment *pQStack_40;
  EdgeColor edgeColor_local;
  QuadraticSegment *this_local;
  Point2 p2_local;
  Point2 p1_local;
  Point2 p0_local;
  
  p2_local.x = p2.y;
  this_local = (QuadraticSegment *)p2.x;
  p1_local.x = p1.y;
  p2_local.y = p1.x;
  p1_local.y = p0.x;
  local_44 = edgeColor;
  pQStack_40 = this;
  EdgeSegment::EdgeSegment(&this->super_EdgeSegment,edgeColor);
  (this->super_EdgeSegment)._vptr_EdgeSegment = (_func_int **)&PTR__QuadraticSegment_00237090;
  local_80 = this->p;
  do {
    Vector2::Vector2(local_80,0.0);
    local_80 = local_80 + 1;
  } while ((QuadraticSegment *)local_80 != this + 1);
  bVar1 = Vector2::operator==((Vector2 *)&p2_local.y,(Vector2 *)&p1_local.y);
  if (!bVar1) {
    bVar1 = Vector2::operator==((Vector2 *)&p2_local.y,(Vector2 *)&this_local);
    PVar2.y = p1_local.x;
    PVar2.x = p2_local.y;
    if (!bVar1) goto LAB_001d282f;
  }
  local_78[0] = Vector2::operator+((Vector2 *)&p1_local.y,(Vector2 *)&this_local);
  PVar2 = msdfgen::operator*(0.5,local_78);
LAB_001d282f:
  this->p[0].x = p1_local.y;
  this->p[0].y = p0.y;
  this->p[1] = PVar2;
  this->p[2].x = (double)this_local;
  this->p[2].y = p2_local.x;
  return;
}

Assistant:

QuadraticSegment::QuadraticSegment(Point2 p0, Point2 p1, Point2 p2, EdgeColor edgeColor) : EdgeSegment(edgeColor) {
    if (p1 == p0 || p1 == p2)
        p1 = 0.5*(p0+p2);
    p[0] = p0;
    p[1] = p1;
    p[2] = p2;
}